

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O1

double __thiscall
ChebTools::ChebyshevCollection::integrate(ChebyshevCollection *this,double xmin,double xmax)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChebyshevExpansion I;
  double local_98;
  double local_88;
  ChebyshevExpansion local_78;
  double local_38;
  
  uVar1 = get_index(this,xmin);
  uVar2 = get_index(this,xmax);
  if (uVar2 == uVar1) {
    ChebyshevExpansion::integrate
              (&local_78,
               (this->m_exps).
               super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)uVar1,1);
    local_98 = ChebyshevExpansion::y_Clenshaw_xscaled
                         (&local_78,
                          ((xmax + xmax) - (local_78.m_xmax + local_78.m_xmin)) /
                          (local_78.m_xmax - local_78.m_xmin));
    dVar5 = ChebyshevExpansion::y_Clenshaw_xscaled
                      (&local_78,
                       ((xmin + xmin) - (local_78.m_xmax + local_78.m_xmin)) /
                       (local_78.m_xmax - local_78.m_xmin));
    local_98 = local_98 - dVar5;
  }
  else {
    local_88 = 0.0;
    if ((int)(uVar1 + 1) < (int)uVar2) {
      lVar3 = (long)(int)(uVar1 + 1) << 6;
      iVar4 = ~uVar1 + uVar2;
      local_88 = 0.0;
      do {
        ChebyshevExpansion::integrate
                  (&local_78,
                   (ChebyshevExpansion *)
                   ((long)&(((this->m_exps).
                             super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_c).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + lVar3),1
                  );
        dVar5 = ChebyshevExpansion::y_Clenshaw_xscaled
                          (&local_78,
                           ((local_78.m_xmax + local_78.m_xmax) -
                           (local_78.m_xmax + local_78.m_xmin)) /
                           (local_78.m_xmax - local_78.m_xmin));
        dVar6 = ChebyshevExpansion::y_Clenshaw_xscaled
                          (&local_78,
                           ((local_78.m_xmin + local_78.m_xmin) -
                           (local_78.m_xmin + local_78.m_xmax)) /
                           (local_78.m_xmax - local_78.m_xmin));
        local_88 = local_88 + (dVar5 - dVar6);
        free(local_78.m_nodal_value_cache.
             super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        free(local_78.m_recurrence_buffer.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        free(local_78.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        lVar3 = lVar3 + 0x40;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    ChebyshevExpansion::integrate
              (&local_78,
               (this->m_exps).
               super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)uVar1,1);
    local_38 = ChebyshevExpansion::y_Clenshaw_xscaled
                         (&local_78,
                          ((local_78.m_xmax + local_78.m_xmax) - (local_78.m_xmax + local_78.m_xmin)
                          ) / (local_78.m_xmax - local_78.m_xmin));
    dVar5 = ChebyshevExpansion::y_Clenshaw_xscaled
                      (&local_78,
                       ((xmin + xmin) - (local_78.m_xmax + local_78.m_xmin)) /
                       (local_78.m_xmax - local_78.m_xmin));
    free(local_78.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    free(local_78.m_recurrence_buffer.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
         .m_storage.m_data);
    free(local_78.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    ChebyshevExpansion::integrate
              (&local_78,
               (this->m_exps).
               super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)uVar2,1);
    dVar6 = ChebyshevExpansion::y_Clenshaw_xscaled
                      (&local_78,
                       ((xmax + xmax) - (local_78.m_xmax + local_78.m_xmin)) /
                       (local_78.m_xmax - local_78.m_xmin));
    dVar7 = ChebyshevExpansion::y_Clenshaw_xscaled
                      (&local_78,
                       ((local_78.m_xmin + local_78.m_xmin) - (local_78.m_xmin + local_78.m_xmax)) /
                       (local_78.m_xmax - local_78.m_xmin));
    local_98 = (dVar6 - dVar7) + local_88 + (local_38 - dVar5);
  }
  free(local_78.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_78.m_recurrence_buffer.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_78.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  return local_98;
}

Assistant:

auto integrate(double xmin, double xmax) const {
            // Bisection to find the expansions we need
            auto imin = get_index(xmin), imax = get_index(xmax);
            if (imax == imin) {
                auto I = m_exps[imin].integrate(1);
                return I.y(xmax) - I.y(xmin);
            }
            else {
                // All the intervals between the two ones containing the limits (non-inclusive)
                // contribute the full amount, integrating from xmin to xmax
                double s = 0;
                for (auto i = imin + 1; i < imax; ++i) {
                    auto I = m_exps[i].integrate(1);
                    s += I.y(I.xmax()) - I.y(I.xmin());
                }
                // Bottom is from value to right edge
                {
                    auto I = m_exps[imin].integrate(1);
                    s += I.y(I.xmax()) - I.y(xmin);
                }
                // Top is from value to left edge
                {
                    auto I = m_exps[imax].integrate(1);
                    s += I.y(xmax) - I.y(I.xmin());
                }
                return s;
            }
        }